

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkSopEsopCover(Abc_Ntk_t *pNtk,int nFaninMax,int fUseEsop,int fUseSop,int fUseInvs,int fVerbose
                   )

{
  uint *puVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  Cov_Man_t *p;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Ntk_t *pNtk_00;
  long lVar9;
  int level;
  Cov_Man_t *pCVar10;
  timespec ts;
  timespec local_40;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covCore.c"
                  ,0x41,"Abc_Ntk_t *Abc_NtkSopEsopCover(Abc_Ntk_t *, int, int, int, int, int)");
  }
  p = Cov_ManAlloc(pNtk,nFaninMax);
  p->fUseEsop = fUseEsop;
  p->fUseSop = fUseSop;
  pNtk->pManCut = p;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pVVar5 = Abc_NtkFanoutCounts(pNtk);
  p->vFanCounts = pVVar5;
  pAVar6 = Abc_AigConst1(pNtk);
  pAVar6->field_0x14 = pAVar6->field_0x14 | 0x10;
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      puVar1 = (uint *)((long)pVVar8->pArray[lVar7] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar7 < pVVar8->nSize);
  }
  iVar3 = 0;
  do {
    if (fVerbose == 0) {
      pCVar10 = p;
      iVar4 = Abc_NtkCovCoversOne(p,pNtk,0);
      level = (int)pCVar10;
    }
    else {
      printf("Iter %d : ",(ulong)(iVar3 + 1));
      pCVar10 = p;
      iVar4 = Abc_NtkCovCoversOne(p,pNtk,fVerbose);
      level = (int)pCVar10;
    }
    iVar3 = iVar3 + 1;
  } while (iVar4 == 0);
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (pVVar8->pArray[lVar7] != (void *)0x0) {
        pbVar2 = (byte *)((long)pVVar8->pArray[lVar7] + 0x14);
        *pbVar2 = *pbVar2 & 0xef;
        pVVar8 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar8->nSize);
  }
  if (fVerbose != 0) {
    Abc_Print(level,"%s =","Total");
    iVar4 = 3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar7 + lVar9) / 1000000.0);
  }
  pNtk_00 = Abc_NtkCovDeriveRegular(p,pNtk);
  Cov_ManFree(p);
  pNtk->pManCut = (void *)0x0;
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    iVar3 = Abc_NtkCheck(pNtk_00);
    if (iVar3 != 0) {
      return pNtk_00;
    }
    puts("Abc_NtkCov: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkSopEsopCover( Abc_Ntk_t * pNtk, int nFaninMax, int fUseEsop, int fUseSop, int fUseInvs, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Cov_Man_t * p;

    assert( Abc_NtkIsStrash(pNtk) );

    // create the manager
    p = Cov_ManAlloc( pNtk, nFaninMax );
    p->fUseEsop = fUseEsop;
    p->fUseSop  = fUseSop;
    pNtk->pManCut = p;

    // perform mapping
    Abc_NtkCovCovers( p, pNtk, fVerbose );

    // derive the final network
//    if ( fUseInvs )
//        pNtkNew = Abc_NtkCovDeriveClean( p, pNtk );
//      else
//       pNtkNew = Abc_NtkCovDerive( p, pNtk );
//    pNtkNew = NULL;
    pNtkNew = Abc_NtkCovDeriveRegular( p, pNtk );

    Cov_ManFree( p );
    pNtk->pManCut = NULL;

    // make sure that everything is okay
    if ( pNtkNew && !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCov: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}